

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_3,_2,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  int col;
  long lVar3;
  int row;
  long lVar4;
  long lVar5;
  float v;
  float fVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined4 uVar10;
  Vector<float,_3> res;
  undefined8 local_50;
  undefined4 local_48;
  int aiStack_40 [6];
  Mat3 m;
  long lVar8;
  
  local_48 = DAT_0223f8d8;
  local_50 = s_constInVec3;
  pfVar1 = (float *)&m;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar7 = _DAT_019f34d0;
    do {
      bVar9 = SUB164(auVar7 ^ _DAT_019ec5b0,4) == -0x80000000 &&
              SUB164(auVar7 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar9) {
        uVar10 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar10;
      }
      if (bVar9) {
        uVar10 = 0x3f800000;
        if (lVar3 + -0xc != lVar5) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5 + 0xc) = uVar10;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x30);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar4 != 3);
  pVVar2 = (Vector<float,_3> *)&m;
  m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  m.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  m.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  m.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  m.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  m.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  m.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    fVar6 = 0.0;
    lVar4 = 0;
    do {
      fVar6 = fVar6 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar2->m_data)->m_data[0].m_data[lVar4]
                      * *(float *)((long)&local_50 + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    res.m_data[lVar3] = fVar6;
    lVar3 = lVar3 + 1;
    pVVar2 = pVVar2 + 1;
  } while (lVar3 != 3);
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (const Vector<T, Size>& v)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = v.m_data[i];
}